

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool __thiscall parser::state::set_memo(state *this,posn *p,ind id,memo *m)

{
  ulong uVar1;
  ulong uVar2;
  _Map_pointer ppuVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ind iVar8;
  ind iVar9;
  ind iVar10;
  undefined3 uVar11;
  int iVar12;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_parser::memo>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar13;
  undefined4 extraout_var;
  ulong uVar15;
  ulong __n;
  ind local_38;
  dyn *pdVar14;
  
  uVar1 = p->i;
  uVar2 = (this->off).i;
  __n = uVar1 - uVar2;
  if (uVar2 <= uVar1) {
    ppuVar3 = (this->memo_table).
              super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar15 = ((long)(this->memo_table).
                    super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->memo_table).
                    super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x6db6db6db6db6db7 +
             ((long)(this->memo_table).
                    super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->memo_table).
                    super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * 0x6db6db6db6db6db7 +
             (((long)ppuVar3 -
               (long)(this->memo_table).
                     super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(ppuVar3 == (_Map_pointer)0x0)) * 9;
    local_38 = id;
    if (uVar15 <= __n) {
      do {
        std::
        deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
        ::emplace_back<>(&this->memo_table);
        uVar15 = uVar15 + 1;
      } while (uVar15 <= __n);
    }
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_parser::memo>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::
                 _Deque_iterator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_&,_std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_*>
                 ::operator[](&(this->memo_table).
                               super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start,__n);
    pmVar13 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_parser::memo>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_00,&local_38);
    uVar11 = *(undefined3 *)&m->field_0x1;
    uVar4 = *(undefined4 *)&m->field_0x4;
    iVar8 = (m->end).i;
    uVar5 = *(undefined4 *)((long)&(m->end).i + 4);
    iVar9 = (m->end).ln;
    uVar6 = *(undefined4 *)((long)&(m->end).ln + 4);
    iVar10 = (m->end).cl;
    uVar7 = *(undefined4 *)((long)&(m->end).cl + 4);
    pmVar13->success = m->success;
    *(undefined3 *)&pmVar13->field_0x1 = uVar11;
    *(undefined4 *)&pmVar13->field_0x4 = uVar4;
    *(int *)&(pmVar13->end).i = (int)iVar8;
    *(undefined4 *)((long)&(pmVar13->end).i + 4) = uVar5;
    *(int *)&(pmVar13->end).ln = (int)iVar9;
    *(undefined4 *)((long)&(pmVar13->end).ln + 4) = uVar6;
    *(int *)&(pmVar13->end).cl = (int)iVar10;
    *(undefined4 *)((long)&(pmVar13->end).cl + 4) = uVar7;
    if (pmVar13 != m) {
      pdVar14 = (pmVar13->result).p;
      if (pdVar14 != (dyn *)0x0) {
        (*pdVar14->_vptr_dyn[1])();
      }
      pdVar14 = (m->result).p;
      if (pdVar14 == (dyn *)0x0) {
        pdVar14 = (dyn *)0x0;
      }
      else {
        iVar12 = (*pdVar14->_vptr_dyn[3])();
        pdVar14 = (dyn *)CONCAT44(extraout_var,iVar12);
      }
      (pmVar13->result).p = pdVar14;
    }
  }
  return uVar2 <= uVar1;
}

Assistant:

bool set_memo(const struct posn& p, ind id, const struct memo& m) {
			// ignore forgotten position
			if ( p < off ) return false;
			
			// ensure table initialized
			ind i = p.i - off.i;
			for (ind ii = memo_table.size(); ii <= i; ++ii) memo_table.emplace_back();
			
			// set table entry
			memo_table[i][id] = m;
			return true;
		}